

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_set_all_gej_var(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  uint64_t *puVar1;
  byte bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  size_t unaff_RBP;
  secp256k1_ge *psVar11;
  secp256k1_ge *a_00;
  secp256k1_gej *a_01;
  secp256k1_fe *b;
  secp256k1_ge *a_02;
  size_t sVar12;
  int *piVar13;
  bool bVar14;
  secp256k1_fe u;
  secp256k1_ge_storage sStack_b0;
  code *pcStack_70;
  size_t local_68;
  uint64_t local_60;
  uint64_t uStack_58;
  uint64_t local_50;
  uint64_t uStack_48;
  uint64_t local_40;
  undefined8 uStack_38;
  
  a_01 = a;
  sVar12 = len;
  local_68 = len;
  if (len == 0) {
    sVar12 = 0xffffffffffffffff;
  }
  else {
    do {
      pcStack_70 = (code *)0x14e89d;
      secp256k1_gej_verify(a_01);
      sVar12 = sVar12 - 1;
      a_01 = a_01 + 1;
    } while (sVar12 != 0);
    b = &a->z;
    sVar12 = 0xffffffffffffffff;
    unaff_RBP = 0;
    psVar11 = r;
    do {
      if ((int)b[1].n[0] == 0) {
        if (sVar12 == 0xffffffffffffffff) {
          uVar3 = b->n[0];
          uVar4 = b->n[1];
          uVar5 = b->n[2];
          uVar6 = b->n[3];
          iVar7 = b->magnitude;
          iVar8 = b->normalized;
          (psVar11->x).n[4] = b->n[4];
          (psVar11->x).magnitude = iVar7;
          (psVar11->x).normalized = iVar8;
          (psVar11->x).n[2] = uVar5;
          (psVar11->x).n[3] = uVar6;
          (psVar11->x).n[0] = uVar3;
          (psVar11->x).n[1] = uVar4;
          sVar12 = unaff_RBP;
        }
        else {
          pcStack_70 = (code *)0x14e8ed;
          secp256k1_fe_mul(&psVar11->x,&r[sVar12].x,b);
          sVar12 = unaff_RBP;
        }
      }
      else {
        pcStack_70 = (code *)0x14e8cc;
        secp256k1_ge_set_infinity(psVar11);
        len = local_68;
      }
      unaff_RBP = unaff_RBP + 1;
      psVar11 = psVar11 + 1;
      b = (secp256k1_fe *)(b[3].n + 1);
    } while (len != unaff_RBP);
  }
  if (sVar12 != 0xffffffffffffffff) {
    psVar11 = r + sVar12;
    a_00 = (secp256k1_ge *)&stack0xffffffffffffffa0;
    pcStack_70 = (code *)0x14e94d;
    secp256k1_fe_inv_var((secp256k1_fe *)a_00,&psVar11->x);
    sVar10 = local_68;
    if (sVar12 != 0) {
      unaff_RBP = sVar12 - 1;
      piVar13 = &a[sVar12 - 1].infinity;
      a_02 = r + sVar12;
      do {
        a_02 = a_02 + -1;
        if (*piVar13 == 0) {
          pcStack_70 = (code *)0x14e991;
          secp256k1_fe_mul(&r[sVar12].x,&a_02->x,(secp256k1_fe *)&stack0xffffffffffffffa0);
          sVar10 = local_68;
          psVar11 = (secp256k1_ge *)&stack0xffffffffffffffa0;
          pcStack_70 = (code *)0x14e9b1;
          a_00 = psVar11;
          secp256k1_fe_mul((secp256k1_fe *)psVar11,(secp256k1_fe *)psVar11,&a[sVar12].z);
          sVar12 = unaff_RBP;
        }
        piVar13 = piVar13 + -0x26;
        bVar14 = unaff_RBP != 0;
        unaff_RBP = unaff_RBP - 1;
      } while (bVar14);
    }
    if (a[sVar12].infinity != 0) {
      pcStack_70 = secp256k1_ge_from_bytes_ext;
      secp256k1_ge_set_all_gej_var_cold_1();
      lVar9 = 0;
      do {
        bVar2 = *(byte *)((long)(psVar11->x).n + lVar9);
        sStack_b0.y.n[2] = (uint64_t)bVar2;
        if (bVar2 != 0) goto LAB_0014ea71;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x40);
      sStack_b0.y.n[2] = 0;
LAB_0014ea71:
      if ((int)sStack_b0.y.n[2] != 0) {
        sStack_b0.x.n[0] = (psVar11->x).n[0];
        sStack_b0.x.n[1] = (psVar11->x).n[1];
        sStack_b0.x.n[2] = (psVar11->x).n[2];
        sStack_b0.x.n[3] = (psVar11->x).n[3];
        sStack_b0.y.n[0] = (psVar11->x).n[4];
        sStack_b0.y.n[1]._0_4_ = (psVar11->x).magnitude;
        sStack_b0.y.n[1]._4_4_ = (psVar11->x).normalized;
        sStack_b0.y.n[2] = (psVar11->y).n[0];
        sStack_b0.y.n[3] = (psVar11->y).n[1];
        secp256k1_ge_from_storage(a_00,&sStack_b0);
        return;
      }
      sStack_b0.y.n[3] = sVar10;
      pcStack_70 = (code *)unaff_RBP;
      a_00->infinity = 1;
      (a_00->x).n[0] = 0;
      (a_00->x).n[1] = 0;
      (a_00->x).n[2] = 0;
      (a_00->x).n[3] = 0;
      *(undefined8 *)((long)(a_00->x).n + 0x1c) = 0;
      *(undefined8 *)((long)(a_00->x).n + 0x24) = 0;
      (a_00->x).normalized = 1;
      sStack_b0.y.n[1] = 0x149465;
      secp256k1_fe_verify(&a_00->x);
      *(undefined8 *)((long)(a_00->y).n + 0x1c) = 0;
      *(undefined8 *)((long)(a_00->y).n + 0x24) = 0;
      (a_00->y).n[2] = 0;
      (a_00->y).n[3] = 0;
      (a_00->y).n[0] = 0;
      (a_00->y).n[1] = 0;
      (a_00->y).normalized = 1;
      sStack_b0.y.n[1] = 0x149480;
      secp256k1_fe_verify(&a_00->y);
      secp256k1_ge_verify(a_00);
      return;
    }
    puVar1 = r[sVar12].x.n + 4;
    *puVar1 = local_40;
    puVar1[1] = uStack_38;
    puVar1 = r[sVar12].x.n + 2;
    *puVar1 = local_50;
    puVar1[1] = uStack_48;
    r[sVar12].x.n[0] = local_60;
    r[sVar12].x.n[1] = uStack_58;
    psVar11 = r;
    sVar12 = sVar10;
    if (sVar10 != 0) {
      do {
        if (a->infinity == 0) {
          pcStack_70 = (code *)0x14ea24;
          secp256k1_ge_set_gej_zinv(psVar11,a,&psVar11->x);
        }
        a = a + 1;
        sVar12 = sVar12 - 1;
        psVar11 = psVar11 + 1;
      } while (sVar12 != 0);
      do {
        pcStack_70 = (code *)0x14ea3c;
        secp256k1_ge_verify(r);
        r = r + 1;
        sVar10 = sVar10 - 1;
      } while (sVar10 != 0);
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej_var(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
    size_t last_i = SIZE_MAX;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
    }
#endif

    for (i = 0; i < len; i++) {
        if (a[i].infinity) {
            secp256k1_ge_set_infinity(&r[i]);
        } else {
            /* Use destination's x coordinates as scratch space */
            if (last_i == SIZE_MAX) {
                r[i].x = a[i].z;
            } else {
                secp256k1_fe_mul(&r[i].x, &r[last_i].x, &a[i].z);
            }
            last_i = i;
        }
    }
    if (last_i == SIZE_MAX) {
        return;
    }
    secp256k1_fe_inv_var(&u, &r[last_i].x);

    i = last_i;
    while (i > 0) {
        i--;
        if (!a[i].infinity) {
            secp256k1_fe_mul(&r[last_i].x, &r[i].x, &u);
            secp256k1_fe_mul(&u, &u, &a[last_i].z);
            last_i = i;
        }
    }
    VERIFY_CHECK(!a[last_i].infinity);
    r[last_i].x = u;

    for (i = 0; i < len; i++) {
        if (!a[i].infinity) {
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}